

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_test.cc
# Opt level: O0

void __thiscall
fizplex::SimplexTest_NonBindingRowFreeVarUnbounded_Test::
~SimplexTest_NonBindingRowFreeVarUnbounded_Test
          (SimplexTest_NonBindingRowFreeVarUnbounded_Test *this)

{
  void *in_RDI;
  
  ~SimplexTest_NonBindingRowFreeVarUnbounded_Test
            ((SimplexTest_NonBindingRowFreeVarUnbounded_Test *)0x1d14f8);
  operator_delete(in_RDI,0xc0);
  return;
}

Assistant:

TEST_F(SimplexTest, NonBindingRowFreeVarUnbounded) {
  lp.add_column(ColType::Free, -inf, inf, 1);
  lp.add_row(RowType::NonBinding, -inf, inf, {1});

  solve_lp();
  EXPECT_EQ(Simplex::Result::Unbounded, result);
  EXPECT_TRUE(is_infinite(z));
  EXPECT_TRUE(is_le(z, 0));
  EXPECT_TRUE(is_infinite(x[0]));
}